

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::RemoveModelComponent(ONX_Model *this,Type component_type,ON_UUID component_id)

{
  uchar uVar1;
  bool bVar2;
  Type TVar3;
  ON_ComponentManifestItem *__src;
  ON__UINT64 model_component_runtime_serial_number;
  ONX_ModelComponentReferenceLink *mcr_link_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined7 in_register_00000031;
  ONX_Model *this_00;
  uchar in_R8 [8];
  ON_UUID OVar5;
  ON_ModelComponentReference OVar6;
  ONX_ModelComponentReferenceLink *mcr_link;
  undefined1 local_80 [8];
  ON_ComponentManifestItem item;
  Type component_type_local;
  ONX_Model *this_local;
  ON_UUID component_id_local;
  ON_ModelComponentReference *mcr;
  
  this_00 = (ONX_Model *)CONCAT71(in_register_00000031,component_type);
  item.m_name_hash.m_parent_id.Data4[7] = (uchar)component_id.Data1;
  OVar5.Data4 = in_R8;
  OVar5._0_8_ = component_id.Data4;
  __src = ON_ComponentManifest::ItemFromId(&this_00->m_manifest,OVar5);
  memcpy(local_80,__src,0x50);
  bVar2 = ON_ComponentManifestItem::IsUnset((ON_ComponentManifestItem *)local_80);
  uVar1 = item.m_name_hash.m_parent_id.Data4[7];
  if (bVar2) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x47a,"","Invalid component_id parameter.");
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var4._M_pi = extraout_RDX;
  }
  else if ((item.m_name_hash.m_parent_id.Data4[7] == '\0') ||
          (TVar3 = ON_ComponentManifestItem::ComponentType((ON_ComponentManifestItem *)local_80),
          uVar1 == TVar3)) {
    OVar5 = ON_ComponentManifestItem::Id((ON_ComponentManifestItem *)local_80);
    bVar2 = ON_ComponentManifest::RemoveComponent(&this_00->m_manifest,OVar5);
    if (bVar2) {
      model_component_runtime_serial_number =
           ON_ComponentManifestItem::ComponentRuntimeSerialNumber
                     ((ON_ComponentManifestItem *)local_80);
      mcr_link_00 = Internal_ModelComponentLinkFromSerialNumber
                              (this_00,model_component_runtime_serial_number);
      if (mcr_link_00 == (ONX_ModelComponentReferenceLink *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x48b,"","component not in model.");
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
        _Var4._M_pi = extraout_RDX_02;
      }
      else {
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&mcr_link_00->m_mcr);
        Internal_RemoveModelComponentReferenceLink(this_00,mcr_link_00);
        _Var4._M_pi = extraout_RDX_03;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                 ,0x484,"","Unable to remove component from manifest.");
      ON_ModelComponentReference::ON_ModelComponentReference
                ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x47f,"","Invalid model_component type.");
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var4._M_pi = extraout_RDX_00;
  }
  OVar6.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  OVar6.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar6.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::RemoveModelComponent(
  ON_ModelComponent::Type component_type,
  ON_UUID component_id
  )
{
  const ON_ComponentManifestItem item = m_manifest.ItemFromId(component_id);
  if (item.IsUnset())
  {
    ON_ERROR("Invalid component_id parameter.");
    return ON_ModelComponentReference::Empty;
  }
  if (ON_ModelComponent::Type::Unset != component_type && component_type != item.ComponentType())
  {
    ON_ERROR("Invalid model_component type.");
    return ON_ModelComponentReference::Empty;
  }
  if (!m_manifest.RemoveComponent(item.Id()))
  {
    ON_ERROR("Unable to remove component from manifest.");
    return ON_ModelComponentReference::Empty;
  }

  ONX_ModelComponentReferenceLink* mcr_link = Internal_ModelComponentLinkFromSerialNumber(item.ComponentRuntimeSerialNumber());
  if (nullptr == mcr_link)
  {
    ON_ERROR("component not in model.");
    return ON_ModelComponentReference::Empty;
  }
  ON_ModelComponentReference mcr = mcr_link->m_mcr;
  Internal_RemoveModelComponentReferenceLink(mcr_link);
  return mcr;
}